

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_int>::calculateOverlappingPairs
          (btAxisSweep3Internal<unsigned_int> *this,btDispatcher *dispatcher)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  btBroadphasePair *a;
  undefined8 in_RSI;
  btAxisSweep3Internal<unsigned_int> *in_RDI;
  bool hasOverlap;
  bool needsRemoval;
  bool isDuplicate;
  btBroadphasePair *pair;
  btBroadphasePair previousPair;
  int i;
  btBroadphasePairArray *overlappingPairArray;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  btAlignedObjectArray<btBroadphasePair> *in_stack_ffffffffffffff50;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btBroadphaseProxy *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 in_stack_ffffffffffffff80;
  btBroadphasePair local_68;
  int local_44;
  btBroadphasePair local_40;
  btAlignedObjectArray<btBroadphasePair> *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  uVar2 = (*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [0xe])();
  if ((uVar2 & 1) != 0) {
    iVar3 = (*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [7])();
    local_18 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var,iVar3);
    btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
              (in_stack_ffffffffffffff50,
               (btBroadphasePairSortPredicate *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    this_00 = local_18;
    btAlignedObjectArray<btBroadphasePair>::size(local_18);
    btBroadphasePair::btBroadphasePair(&local_40);
    btAlignedObjectArray<btBroadphasePair>::resize
              ((btAlignedObjectArray<btBroadphasePair> *)in_stack_ffffffffffffff80.m_internalInfo1,
               in_stack_ffffffffffffff7c,(btBroadphasePair *)in_stack_ffffffffffffff70);
    in_RDI->m_invalidPair = 0;
    btBroadphasePair::btBroadphasePair(&local_68);
    local_68.m_pProxy0 = (btBroadphaseProxy *)0x0;
    local_68.m_pProxy1 = (btBroadphaseProxy *)0x0;
    local_68.m_algorithm = (btCollisionAlgorithm *)0x0;
    local_44 = 0;
    while (iVar3 = local_44, iVar4 = btAlignedObjectArray<btBroadphasePair>::size(local_18),
          iVar3 < iVar4) {
      a = btAlignedObjectArray<btBroadphasePair>::operator[](local_18,local_44);
      bVar1 = operator==(a,&local_68);
      local_68.m_pProxy0 = a->m_pProxy0;
      local_68.m_pProxy1 = a->m_pProxy1;
      local_68.m_algorithm = a->m_algorithm;
      local_68.field_3 = a->field_3;
      if (bVar1) {
        bVar1 = true;
      }
      else {
        bVar1 = testAabbOverlap(in_RDI,a->m_pProxy0,a->m_pProxy1);
        bVar1 = !bVar1;
      }
      if (bVar1) {
        (*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[8])
                  (in_RDI->m_pairCache,a,local_10);
        a->m_pProxy0 = (btBroadphaseProxy *)0x0;
        a->m_pProxy1 = (btBroadphaseProxy *)0x0;
        in_RDI->m_invalidPair = in_RDI->m_invalidPair + 1;
        gOverlappingPairs = gOverlappingPairs + -1;
      }
      local_44 = local_44 + 1;
    }
    btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
              (this_00,(btBroadphasePairSortPredicate *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
    btAlignedObjectArray<btBroadphasePair>::size(local_18);
    btBroadphasePair::btBroadphasePair((btBroadphasePair *)&stack0xffffffffffffff68);
    btAlignedObjectArray<btBroadphasePair>::resize
              ((btAlignedObjectArray<btBroadphasePair> *)in_stack_ffffffffffffff80.m_internalInfo1,
               in_stack_ffffffffffffff7c,(btBroadphasePair *)in_stack_ffffffffffffff70);
    in_RDI->m_invalidPair = 0;
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::calculateOverlappingPairs(btDispatcher* dispatcher)
{

	if (m_pairCache->hasDeferredRemoval())
	{
	
		btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				///important to use an AABB test that is consistent with the broadphase
				bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

				if (hasOverlap)
				{
					needsRemoval = false;//callback->processOverlap(pair);
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_pairCache->cleanOverlappingPair(pair,dispatcher);

		//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
		//		m_overlappingPairArray.pop_back();
				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				m_invalidPair++;
				gOverlappingPairs--;
			} 
			
		}

	///if you don't like to skip the invalid pairs in the array, execute following code:
	#define CLEAN_INVALID_PAIRS 1
	#ifdef CLEAN_INVALID_PAIRS

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;
	#endif//CLEAN_INVALID_PAIRS
		
		//printf("overlappingPairArray.size()=%d\n",overlappingPairArray.size());
	}

}